

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineBuffer.cpp
# Opt level: O1

void __thiscall yb::LineBuffer::move(LineBuffer *this,int n)

{
  pointer pcVar1;
  
  if ((n < 0) &&
     (pcVar1 = (this->buffer_)._M_dataplus._M_p,
     (long)(this->position_)._M_current - (long)pcVar1 < (long)(ulong)(uint)-n)) {
    (this->position_)._M_current = pcVar1;
  }
  else {
    (this->position_)._M_current = (this->position_)._M_current + n;
  }
  return;
}

Assistant:

void LineBuffer::move(int n) {
    auto begin = std::begin(buffer_);
    if (n < 0 && std::distance(begin, position_) < -n) {
        position_ = begin;
    }
    else {
        position_ += n;
    }
}